

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

String * __thiscall String::trim(String *this,char *chars)

{
  char *pcVar1;
  usize uVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  long start;
  String local_58;
  
  uVar2 = this->data->len;
  if (uVar2 != 0) {
    pcVar6 = this->data->str;
    start = 0;
    while ((pcVar1 = pcVar6 + start, lVar3 = start, pcVar1 < pcVar6 + uVar2 &&
           (pcVar4 = strchr(chars,(int)*pcVar1), pcVar4 != (char *)0x0))) {
      start = start + 1;
    }
    do {
      lVar5 = lVar3;
      pcVar6 = pcVar6 + -1;
      if (pcVar6 + uVar2 <= pcVar1) break;
      pcVar4 = strchr(chars,(int)pcVar6[uVar2]);
      lVar3 = lVar5 + 1;
    } while (pcVar4 != (char *)0x0);
    if (lVar5 != 0) {
      substr(&local_58,this,start,uVar2 - lVar5);
      operator=(this,&local_58);
      ~String(&local_58);
    }
  }
  return this;
}

Assistant:

String& String::trim(const char* chars)
{
  if(data->len)
  {
    const char* start = data->str;
    const char* p = start;
    const char* end = start + data->len;
    for(; p < end; ++p)
      if(!strchr(chars, *p))
        break;
    --end;
    for(; end > p; --end)
      if(!strchr(chars, *end))
        break;
    ++end;
    size_t newLen = end - p;
    if(newLen != data->len)
      *this = substr(p - start, newLen);
  }
  return *this;
}